

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Capturer::~Capturer(Capturer *this)

{
  pointer pMVar1;
  bool bVar2;
  pointer pMVar3;
  reference pvVar4;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_RDI;
  size_t i;
  pointer local_10;
  
  bVar2 = uncaught_exceptions();
  if (!bVar2) {
    pMVar1 = in_RDI[1].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pMVar3 = (pointer)clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::
                      size(in_RDI);
    if (pMVar1 != pMVar3) {
      __assert_fail("m_captured == m_messages.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/dependencies/Catch2/single_include/catch2/catch.hpp"
                    ,0x2e97,"Catch::Capturer::~Capturer()");
    }
    for (local_10 = (pointer)0x0;
        local_10 <
        in_RDI[1].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish;
        local_10 = (pointer)((long)&(local_10->macroName).m_start + 1)) {
      pMVar1 = in_RDI[1].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::
               operator[](in_RDI,(size_type)local_10);
      (**(code **)((pMVar1->macroName).m_start + 0x38))(pMVar1,pvVar4);
    }
  }
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(in_RDI);
  return;
}

Assistant:

Capturer::~Capturer() {
        if ( !uncaught_exceptions() ){
            assert( m_captured == m_messages.size() );
            for( size_t i = 0; i < m_captured; ++i  )
                m_resultCapture.popScopedMessage( m_messages[i] );
        }
    }